

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.cpp
# Opt level: O1

void __thiscall
embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::deleteGeometry
          (BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *this,size_t geomID)

{
  pointer puVar1;
  __uniq_ptr_impl<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>
  _Var2;
  BVHN<4> *pBVar3;
  
  if (geomID < (ulong)((long)(this->bvh->objects).
                             super__Vector_base<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->bvh->objects).
                             super__Vector_base<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3)) {
    puVar1 = (this->builders).
             super__Vector_base<std::unique_ptr<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>,_std::allocator<std::unique_ptr<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    _Var2._M_t.
    super__Tuple_impl<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>
    .
    super__Head_base<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_false>
    ._M_head_impl =
         puVar1[geomID]._M_t.
         super___uniq_ptr_impl<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>
         ._M_t;
    if ((_Tuple_impl<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>
         )_Var2._M_t.
          super__Tuple_impl<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>
          .
          super__Head_base<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_false>
          ._M_head_impl != (RefBuilderBase *)0x0) {
      puVar1[geomID]._M_t.
      super___uniq_ptr_impl<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>
      ._M_t = (tuple<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>
               )0x0;
      (**(code **)(*(long *)_Var2._M_t.
                            super__Tuple_impl<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_std::default_delete<embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase>_>
                            .
                            super__Head_base<0UL,_embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderBase_*,_false>
                            ._M_head_impl + 8))();
    }
    pBVar3 = (this->bvh->objects).
             super__Vector_base<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>._M_impl.
             super__Vector_impl_data._M_start[geomID];
    if (pBVar3 != (BVHN<4> *)0x0) {
      (**(code **)((long)(pBVar3->super_AccelData).super_RefCount._vptr_RefCount + 8))();
    }
    (this->bvh->objects).super__Vector_base<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>.
    _M_impl.super__Vector_impl_data._M_start[geomID] = (BVHN<4> *)0x0;
  }
  return;
}

Assistant:

void BVHNBuilderTwoLevel<N,Mesh,Primitive>::deleteGeometry(size_t geomID)
    {
      if (geomID >= bvh->objects.size()) return;
      if (builders[geomID]) builders[geomID].reset();
      delete bvh->objects [geomID]; bvh->objects [geomID] = nullptr;
    }